

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_skill.cpp
# Opt level: O2

void __thiscall FMapInfoParser::ParseSkill(FMapInfoParser *this)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  FString *pFVar6;
  ulong uVar7;
  FSkillInfo *this_00;
  double dVar8;
  FName replaced;
  FName replacer;
  FName local_134;
  FName local_130;
  FName local_12c;
  FName local_128;
  FName local_124;
  char *local_120;
  FSkillInfo local_118;
  
  FSkillInfo::FSkillInfo(&local_118);
  local_118.AmmoFactor = 1.0;
  local_118.DoubleAmmoFactor = 2.0;
  local_118.DropAmmoFactor = -1.0;
  local_118.DamageFactor = 1.0;
  local_118.ArmorFactor = 1.0;
  local_118.HealthFactor = 1.0;
  local_118.RespawnCounter = 0;
  local_118.RespawnLimit = 0;
  local_118.FastMonsters = false;
  local_118.SlowMonsters = false;
  local_118.DisableCheats = false;
  local_118.AutoUseHealth = false;
  local_118.EasyBossBrain = false;
  local_118.EasyKey = false;
  local_118.Aggressiveness = 1.0;
  local_118.SpawnFilter = 0;
  local_118.ACSReturn = 0;
  local_118.MustConfirm = false;
  local_118.Shortcut = '\0';
  FString::operator=(&local_118.TextColor,(char *)"");
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::Clear(&local_118.Replace,1);
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::Clear(&local_118.Replaced,1);
  local_118.MonsterHealth = 1.0;
  local_118.FriendlyHealth = 1.0;
  local_118.NoPain = false;
  local_118.Infighting = 0;
  FScanner::MustGetString(&this->sc);
  FName::operator=(&local_118.Name,(this->sc).String);
  ParseOpenBrace(this);
  bVar3 = false;
  bVar2 = false;
LAB_004609de:
  bVar4 = FScanner::GetString(&this->sc);
  if (bVar4) {
    bVar4 = FScanner::Compare(&this->sc,"ammofactor");
    if (bVar4) {
      ParseAssign(this);
      FScanner::MustGetFloat(&this->sc);
      local_118.AmmoFactor = (this->sc).Float;
    }
    else {
      bVar4 = FScanner::Compare(&this->sc,"doubleammofactor");
      if (bVar4) {
        ParseAssign(this);
        FScanner::MustGetFloat(&this->sc);
        local_118.DoubleAmmoFactor = (this->sc).Float;
      }
      else {
        bVar4 = FScanner::Compare(&this->sc,"dropammofactor");
        if (bVar4) {
          ParseAssign(this);
          FScanner::MustGetFloat(&this->sc);
          local_118.DropAmmoFactor = (this->sc).Float;
        }
        else {
          bVar4 = FScanner::Compare(&this->sc,"damagefactor");
          if (bVar4) {
            ParseAssign(this);
            FScanner::MustGetFloat(&this->sc);
            local_118.DamageFactor = (this->sc).Float;
          }
          else {
            bVar4 = FScanner::Compare(&this->sc,"fastmonsters");
            if (bVar4) {
              local_118.FastMonsters = true;
            }
            else {
              bVar4 = FScanner::Compare(&this->sc,"slowmonsters");
              if (bVar4) {
                local_118.SlowMonsters = true;
              }
              else {
                bVar4 = FScanner::Compare(&this->sc,"disablecheats");
                if (bVar4) {
                  local_118.DisableCheats = true;
                }
                else {
                  bVar4 = FScanner::Compare(&this->sc,"easybossbrain");
                  if (bVar4) {
                    local_118.EasyBossBrain = true;
                  }
                  else {
                    bVar4 = FScanner::Compare(&this->sc,"easykey");
                    if (bVar4) {
                      local_118.EasyKey = true;
                    }
                    else {
                      bVar4 = FScanner::Compare(&this->sc,"autousehealth");
                      if (bVar4) {
                        local_118.AutoUseHealth = true;
                      }
                      else {
                        bVar4 = FScanner::Compare(&this->sc,"respawntime");
                        if (bVar4) {
                          ParseAssign(this);
                          FScanner::MustGetFloat(&this->sc);
                          local_118.RespawnCounter = (int)((this->sc).Float * 35.0);
                        }
                        else {
                          bVar4 = FScanner::Compare(&this->sc,"respawnlimit");
                          if (bVar4) {
                            ParseAssign(this);
                            FScanner::MustGetNumber(&this->sc);
                            local_118.RespawnLimit = (this->sc).Number;
                          }
                          else {
                            bVar4 = FScanner::Compare(&this->sc,"Aggressiveness");
                            if (bVar4) {
                              ParseAssign(this);
                              FScanner::MustGetFloat(&this->sc);
                              dVar1 = (this->sc).Float;
                              dVar8 = 1.0;
                              if (dVar1 <= 1.0) {
                                dVar8 = dVar1;
                              }
                              local_118.Aggressiveness =
                                   (double)(~-(ulong)(0.0 < dVar1) & 0x3ff0000000000000 |
                                           (ulong)(1.0 - dVar8) & -(ulong)(0.0 < dVar1));
                            }
                            else {
                              bVar4 = FScanner::Compare(&this->sc,"SpawnFilter");
                              if (bVar4) {
                                ParseAssign(this);
                                bVar4 = FScanner::CheckNumber(&this->sc);
                                if (bVar4) {
                                  iVar5 = (this->sc).Number;
                                  if (0 < iVar5) {
                                    local_118.SpawnFilter =
                                         local_118.SpawnFilter | 1 << ((char)iVar5 - 1U & 0x1f);
                                  }
                                }
                                else {
                                  FScanner::MustGetString(&this->sc);
                                  bVar4 = FScanner::Compare(&this->sc,"baby");
                                  if (bVar4) {
                                    local_118.SpawnFilter = local_118.SpawnFilter | 1;
                                  }
                                  else {
                                    bVar4 = FScanner::Compare(&this->sc,"easy");
                                    if (bVar4) {
                                      local_118.SpawnFilter = local_118.SpawnFilter | 2;
                                    }
                                    else {
                                      bVar4 = FScanner::Compare(&this->sc,"normal");
                                      if (bVar4) {
                                        local_118.SpawnFilter = local_118.SpawnFilter | 4;
                                      }
                                      else {
                                        bVar4 = FScanner::Compare(&this->sc,"hard");
                                        if (bVar4) {
                                          local_118.SpawnFilter = local_118.SpawnFilter | 8;
                                        }
                                        else {
                                          bVar4 = FScanner::Compare(&this->sc,"nightmare");
                                          if (bVar4) {
                                            local_118.SpawnFilter = local_118.SpawnFilter | 0x10;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              else {
                                bVar4 = FScanner::Compare(&this->sc,"ACSReturn");
                                if (bVar4) {
                                  ParseAssign(this);
                                  FScanner::MustGetNumber(&this->sc);
                                  local_118.ACSReturn = (this->sc).Number;
                                  bVar2 = true;
                                }
                                else {
                                  bVar4 = FScanner::Compare(&this->sc,"ReplaceActor");
                                  if (!bVar4) {
                                    bVar4 = FScanner::Compare(&this->sc,"Name");
                                    if (bVar4) {
                                      ParseAssign(this);
                                      FScanner::MustGetString(&this->sc);
                                      pFVar6 = &local_118.MenuName;
                                    }
                                    else {
                                      bVar4 = FScanner::Compare(&this->sc,"PlayerClassName");
                                      if (bVar4) {
                                        ParseAssign(this);
                                        FScanner::MustGetString(&this->sc);
                                        FName::FName(&replaced,(this->sc).String);
                                        ParseComma(this);
                                        FScanner::MustGetString(&this->sc);
                                        local_120 = (this->sc).String;
                                        local_134.Index = replaced.Index;
                                        pFVar6 = TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>
                                                 ::operator[](&local_118.MenuNamesForPlayerClass,
                                                              &local_134);
                                        FString::operator=(pFVar6,local_120);
                                        goto LAB_004609de;
                                      }
                                      bVar4 = FScanner::Compare(&this->sc,"PicName");
                                      if (bVar4) {
                                        ParseAssign(this);
                                        FScanner::MustGetString(&this->sc);
                                        pFVar6 = &local_118.PicName;
                                      }
                                      else {
                                        bVar4 = FScanner::Compare(&this->sc,"MustConfirm");
                                        if (!bVar4) {
                                          bVar4 = FScanner::Compare(&this->sc,"Key");
                                          if (bVar4) {
                                            ParseAssign(this);
                                            FScanner::MustGetString(&this->sc);
                                            iVar5 = tolower((int)*(this->sc).String);
                                            local_118.Shortcut = (char)iVar5;
                                          }
                                          else {
                                            bVar4 = FScanner::Compare(&this->sc,"TextColor");
                                            if (bVar4) {
                                              ParseAssign(this);
                                              FScanner::MustGetString(&this->sc);
                                              FString::Format(&local_118.TextColor,"[%s]",
                                                              (this->sc).String);
                                            }
                                            else {
                                              bVar4 = FScanner::Compare(&this->sc,"MonsterHealth");
                                              if (bVar4) {
                                                ParseAssign(this);
                                                FScanner::MustGetFloat(&this->sc);
                                                local_118.MonsterHealth = (this->sc).Float;
                                              }
                                              else {
                                                bVar4 = FScanner::Compare(&this->sc,"FriendlyHealth"
                                                                         );
                                                if (bVar4) {
                                                  ParseAssign(this);
                                                  FScanner::MustGetFloat(&this->sc);
                                                  local_118.FriendlyHealth = (this->sc).Float;
                                                }
                                                else {
                                                  bVar4 = FScanner::Compare(&this->sc,"NoPain");
                                                  if (bVar4) {
                                                    local_118.NoPain = true;
                                                  }
                                                  else {
                                                    bVar4 = FScanner::Compare(&this->sc,
                                                                              "ArmorFactor");
                                                    if (bVar4) {
                                                      ParseAssign(this);
                                                      FScanner::MustGetFloat(&this->sc);
                                                      local_118.ArmorFactor = (this->sc).Float;
                                                    }
                                                    else {
                                                      bVar4 = FScanner::Compare(&this->sc,
                                                                                "HealthFactor");
                                                      if (bVar4) {
                                                        ParseAssign(this);
                                                        FScanner::MustGetFloat(&this->sc);
                                                        local_118.HealthFactor = (this->sc).Float;
                                                      }
                                                      else {
                                                        bVar4 = FScanner::Compare(&this->sc,
                                                                                  "NoInfighting");
                                                        if (bVar4) {
                                                          local_118.Infighting = 0x4000;
                                                        }
                                                        else {
                                                          bVar4 = FScanner::Compare(&this->sc,
                                                                                                                                                                        
                                                  "TotalInfighting");
                                                  if (bVar4) {
                                                    local_118.Infighting = 0x2000;
                                                  }
                                                  else {
                                                    bVar4 = FScanner::Compare(&this->sc,
                                                                              "DefaultSkill");
                                                    if (bVar4) {
                                                      bVar3 = true;
                                                      if (-1 < (long)DefaultSkill) {
                                                        FScanner::ScriptError
                                                                  (&this->sc,
                                                                                                                                      
                                                  "%s is already the default skill\n",
                                                  FName::NameData.NameArray
                                                  [AllSkills.Array[DefaultSkill].Name.Index].Text);
                                                  }
                                                  }
                                                  else {
                                                    bVar4 = ParseCloseBrace(this);
                                                    if (bVar4) goto LAB_0046117d;
                                                    FScanner::ScriptMessage
                                                              (&this->sc,
                                                                                                                              
                                                  "Unknown property \'%s\' found in skill definition\n"
                                                  ,(this->sc).String);
                                                  SkipToNext(this);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                          goto LAB_004609de;
                                        }
                                        local_118.MustConfirm = true;
                                        if (this->format_type == 2) {
                                          bVar4 = CheckAssign(this);
                                          if (!bVar4) goto LAB_004609de;
                                          FScanner::MustGetString(&this->sc);
                                          pFVar6 = &local_118.MustConfirmText;
                                        }
                                        else {
                                          bVar4 = FScanner::CheckToken(&this->sc,0x102);
                                          pFVar6 = &local_118.MustConfirmText;
                                          if (!bVar4) goto LAB_004609de;
                                        }
                                      }
                                    }
                                    FString::operator=(pFVar6,(this->sc).String);
                                    goto LAB_004609de;
                                  }
                                  ParseAssign(this);
                                  FScanner::MustGetString(&this->sc);
                                  FName::FName(&replaced,(this->sc).String);
                                  ParseComma(this);
                                  FScanner::MustGetString(&this->sc);
                                  FName::FName(&replacer,(this->sc).String);
                                  local_124.Index = replaced.Index;
                                  local_128.Index = replacer.Index;
                                  FSkillInfo::SetReplacement(&local_118,&local_124,&local_128);
                                  local_12c.Index = replacer.Index;
                                  local_130.Index = replaced.Index;
                                  FSkillInfo::SetReplacedBy(&local_118,&local_12c,&local_130);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    goto LAB_004609de;
  }
LAB_0046117d:
  CheckEndOfFile(this,"skill");
  uVar7 = 0;
  this_00 = AllSkills.Array;
  do {
    if (AllSkills.Count == uVar7) {
      if (!bVar2) {
        local_118.ACSReturn = AllSkills.Count;
      }
      if (bVar3) {
        DefaultSkill = AllSkills.Count;
      }
      TArray<FSkillInfo,_FSkillInfo>::Push(&AllSkills,&local_118);
LAB_00461208:
      FSkillInfo::~FSkillInfo(&local_118);
      return;
    }
    if ((this_00->Name).Index == local_118.Name.Index) {
      if (!bVar2) {
        local_118.ACSReturn = this_00->ACSReturn;
      }
      FSkillInfo::operator=(this_00,&local_118);
      if (bVar3) {
        DefaultSkill = (int)uVar7;
      }
      goto LAB_00461208;
    }
    uVar7 = uVar7 + 1;
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

void FMapInfoParser::ParseSkill ()
{
	FSkillInfo skill;
	bool thisisdefault = false;
	bool acsreturnisset = false;

	skill.AmmoFactor = 1.;
	skill.DoubleAmmoFactor = 2.;
	skill.DropAmmoFactor = -1.;
	skill.DamageFactor = 1.;
	skill.ArmorFactor = 1.;
	skill.HealthFactor = 1.;
	skill.FastMonsters = false;
	skill.SlowMonsters = false;
	skill.DisableCheats = false;
	skill.EasyBossBrain = false;
	skill.EasyKey = false;
	skill.AutoUseHealth = false;
	skill.RespawnCounter = 0;
	skill.RespawnLimit = 0;
	skill.Aggressiveness = 1.;
	skill.SpawnFilter = 0;
	skill.ACSReturn = 0;
	skill.MustConfirm = false;
	skill.Shortcut = 0;
	skill.TextColor = "";
	skill.Replace.Clear();
	skill.Replaced.Clear();
	skill.MonsterHealth = 1.;
	skill.FriendlyHealth = 1.;
	skill.NoPain = false;
	skill.Infighting = 0;

	sc.MustGetString();
	skill.Name = sc.String;

	ParseOpenBrace();

	while (sc.GetString ())
	{
		if (sc.Compare ("ammofactor"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.AmmoFactor = sc.Float;
		}
		else if (sc.Compare ("doubleammofactor"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.DoubleAmmoFactor = sc.Float;
		}
		else if (sc.Compare ("dropammofactor"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.DropAmmoFactor = sc.Float;
		}
		else if (sc.Compare ("damagefactor"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.DamageFactor = sc.Float;
		}
		else if (sc.Compare ("fastmonsters"))
		{
			skill.FastMonsters = true;
		}
		else if (sc.Compare ("slowmonsters"))
		{
			skill.SlowMonsters = true;
		}
		else if (sc.Compare ("disablecheats"))
		{
			skill.DisableCheats = true;
		}
		else if (sc.Compare ("easybossbrain"))
		{
			skill.EasyBossBrain = true;
		}
		else if (sc.Compare ("easykey"))
		{
			skill.EasyKey = true;
		}
		else if (sc.Compare("autousehealth"))
		{
			skill.AutoUseHealth = true;
		}
		else if (sc.Compare("respawntime"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.RespawnCounter = int(sc.Float*TICRATE);
		}
		else if (sc.Compare("respawnlimit"))
		{
			ParseAssign();
			sc.MustGetNumber ();
			skill.RespawnLimit = sc.Number;
		}
		else if (sc.Compare("Aggressiveness"))
		{
			ParseAssign();
			sc.MustGetFloat ();
			skill.Aggressiveness = 1. - clamp(sc.Float, 0.,1.);
		}
		else if (sc.Compare("SpawnFilter"))
		{
			ParseAssign();
			if (sc.CheckNumber())
			{
				if (sc.Number > 0) skill.SpawnFilter |= (1<<(sc.Number-1));
			}
			else
			{
				sc.MustGetString ();
				if (sc.Compare("baby")) skill.SpawnFilter |= 1;
				else if (sc.Compare("easy")) skill.SpawnFilter |= 2;
				else if (sc.Compare("normal")) skill.SpawnFilter |= 4;
				else if (sc.Compare("hard")) skill.SpawnFilter |= 8;
				else if (sc.Compare("nightmare")) skill.SpawnFilter |= 16;
			}
		}
		else if (sc.Compare("ACSReturn"))
		{
			ParseAssign();
			sc.MustGetNumber ();
			skill.ACSReturn = sc.Number;
			acsreturnisset = true;
		}
		else if (sc.Compare("ReplaceActor"))
		{
			ParseAssign();
			sc.MustGetString();
			FName replaced = sc.String;
			ParseComma();
			sc.MustGetString();
			FName replacer = sc.String;
			skill.SetReplacement(replaced, replacer);
			skill.SetReplacedBy(replacer, replaced);
		}
		else if (sc.Compare("Name"))
		{
			ParseAssign();
			sc.MustGetString ();
			skill.MenuName = sc.String;
		}
		else if (sc.Compare("PlayerClassName"))
		{
			ParseAssign();
			sc.MustGetString ();
			FName pc = sc.String;
			ParseComma();
			sc.MustGetString ();
			skill.MenuNamesForPlayerClass[pc]=sc.String;
		}
		else if (sc.Compare("PicName"))
		{
			ParseAssign();
			sc.MustGetString ();
			skill.PicName = sc.String;
		}
		else if (sc.Compare("MustConfirm"))
		{
			skill.MustConfirm = true;
			if (format_type == FMT_New) 
			{
				if (CheckAssign())
				{
					sc.MustGetString();
					skill.MustConfirmText = sc.String;
				}
			}
			else
			{
				if (sc.CheckToken(TK_StringConst))
				{
					skill.MustConfirmText = sc.String;
				}
			}
		}
		else if (sc.Compare("Key"))
		{
			ParseAssign();
			sc.MustGetString();
			skill.Shortcut = tolower(sc.String[0]);
		}
		else if (sc.Compare("TextColor"))
		{
			ParseAssign();
			sc.MustGetString();
			skill.TextColor.Format("[%s]", sc.String);
		}
		else if (sc.Compare("MonsterHealth"))
		{
			ParseAssign();
			sc.MustGetFloat();
			skill.MonsterHealth = sc.Float;	
		}
		else if (sc.Compare("FriendlyHealth"))
		{
			ParseAssign();
			sc.MustGetFloat();
			skill.FriendlyHealth = sc.Float;
		}
		else if (sc.Compare("NoPain"))
		{
			skill.NoPain = true;
		}
		else if (sc.Compare("ArmorFactor"))
		{
			ParseAssign();
			sc.MustGetFloat();
			skill.ArmorFactor = sc.Float;
		}
		else if (sc.Compare("HealthFactor"))
		{
			ParseAssign();
			sc.MustGetFloat();
			skill.HealthFactor = sc.Float;
		}
		else if (sc.Compare("NoInfighting"))
		{
			skill.Infighting = LEVEL2_NOINFIGHTING;
		}
		else if (sc.Compare("TotalInfighting"))
		{
			skill.Infighting = LEVEL2_TOTALINFIGHTING;
		}
		else if (sc.Compare("DefaultSkill"))
		{
			if (DefaultSkill >= 0)
			{
				sc.ScriptError("%s is already the default skill\n", AllSkills[DefaultSkill].Name.GetChars());
			}
			thisisdefault = true;
		}
		else if (!ParseCloseBrace())
		{
			// Unknown
			sc.ScriptMessage("Unknown property '%s' found in skill definition\n", sc.String);
			SkipToNext();
		}
		else
		{
			break;
		}
	}
	CheckEndOfFile("skill");
	for(unsigned int i = 0; i < AllSkills.Size(); i++)
	{
		if (AllSkills[i].Name == skill.Name)
		{
			if (!acsreturnisset)
			{ // Use the ACS return for the skill we are overwriting.
				skill.ACSReturn = AllSkills[i].ACSReturn;
			}
			AllSkills[i] = skill;
			if (thisisdefault)
			{
				DefaultSkill = i;
			}
			return;
		}
	}
	if (!acsreturnisset)
	{
		skill.ACSReturn = AllSkills.Size();
	}
	if (thisisdefault)
	{
		DefaultSkill = AllSkills.Size();
	}
	AllSkills.Push(skill);
}